

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

bool __thiscall
rapidjson::internal::Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Uint
          (Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,uint u)

{
  size_t i;
  long lVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  uchar *d;
  Number n;
  ulong local_18;
  double local_10;
  
  local_18 = (ulong)u;
  local_10 = (double)u;
  uVar3 = 0xaf63bb4c8601b479;
  lVar1 = 0;
  do {
    uVar3 = (uVar3 ^ *(byte *)((long)&local_18 + lVar1)) * 0x100000001b3;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  puVar2 = Stack<rapidjson::CrtAllocator>::Push<unsigned_long>(&this->stack_,1);
  *puVar2 = uVar3;
  return true;
}

Assistant:

bool Uint(unsigned u) { Number n; n.u.u = u; n.d = static_cast<double>(u); return WriteNumber(n); }